

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool __thiscall
ON_ObjRefEvaluationParameter::GetSubDComponentParameter
          (ON_ObjRefEvaluationParameter *this,ON_SubDComponentParameter *cp)

{
  double p;
  TYPE TVar1;
  ON_SubDFaceParameter fp_00;
  bool bVar2;
  ON_SubDComponentId OVar3;
  ON_SubDComponentParameter local_c8;
  ON_SubDFaceCornerDex local_ac;
  undefined1 local_a8 [8];
  ON_SubDFaceParameter fp;
  ON_SubDComponentId OStack_88;
  ON_SubDFaceCornerDex cdex;
  ON_SubDComponentId face_id;
  ON_SubDComponentParameter local_70;
  ON_SubDComponentId local_58;
  ON_SubDComponentId edge_id;
  ON_SubDComponentParameter local_38;
  ON_SubDComponentId local_20;
  ON_SubDComponentId vertex_id;
  ON_SubDComponentParameter *cp_local;
  ON_ObjRefEvaluationParameter *this_local;
  
  cp->m_cid = ON_SubDComponentParameter::Unset.m_cid;
  cp->m_p0 = ON_SubDComponentParameter::Unset.m_p0;
  cp->m_p1 = ON_SubDComponentParameter::Unset.m_p1;
  vertex_id = (ON_SubDComponentId)cp;
  if (this->m_t_type == 9) {
    TVar1 = (this->m_t_ci).m_type;
    if (TVar1 == subd_vertex) {
      bVar2 = Internal_IsValidUnsigned(this->m_t[0]);
      if ((((bVar2) && (bVar2 = Internal_IsValidUnsigned(this->m_t[1]), bVar2)) &&
          (this->m_t[2] == 0.0)) && (this->m_t[3] == 0.0)) {
        ON_SubDComponentId::ON_SubDComponentId(&local_20,Vertex,(this->m_t_ci).m_index);
        OVar3 = Internal_ComponentIdFromDouble(Edge,this->m_t[0]);
        edge_id = Internal_ComponentIdFromDouble(Face,this->m_t[1]);
        ON_SubDComponentParameter::ON_SubDComponentParameter(&local_38,local_20,OVar3,edge_id);
        *(ON_SubDComponentId *)vertex_id = local_38.m_cid;
        *(anon_union_8_3_6bf0bb0e_for_m_p0 *)((long)vertex_id + 8) = local_38.m_p0;
        *(anon_union_8_3_7b68a318_for_m_p1 *)((long)vertex_id + 0x10) = local_38.m_p1;
      }
    }
    else if (TVar1 == subd_edge) {
      bVar2 = Internal_IsValidUnsigned(this->m_t[0]);
      if (bVar2) {
        bVar2 = false;
        if (0.0 <= this->m_t[1]) {
          bVar2 = this->m_t[1] <= 1.0;
        }
        if (((bVar2) && (this->m_t[2] == 0.0)) && (this->m_t[3] == 0.0)) {
          ON_SubDComponentId::ON_SubDComponentId(&local_58,Edge,(this->m_t_ci).m_index);
          p = this->m_t[1];
          OVar3 = Internal_ComponentIdFromDouble(Face,this->m_t[0]);
          ON_SubDComponentParameter::ON_SubDComponentParameter(&local_70,local_58,p,OVar3);
          *(ON_SubDComponentId *)vertex_id = local_70.m_cid;
          *(anon_union_8_3_6bf0bb0e_for_m_p0 *)((long)vertex_id + 8) = local_70.m_p0;
          *(anon_union_8_3_7b68a318_for_m_p1 *)((long)vertex_id + 0x10) = local_70.m_p1;
        }
      }
    }
    else if (((TVar1 == subd_face) && (bVar2 = Internal_IsValidUnsigned(this->m_t[0]), bVar2)) &&
            ((bVar2 = Internal_IsValidUnsigned(this->m_t[1]), bVar2 && (this->m_t[0] < this->m_t[1])
             ))) {
      bVar2 = false;
      if (0.0 <= this->m_t[2]) {
        bVar2 = this->m_t[2] <= 0.5;
      }
      if (bVar2) {
        bVar2 = false;
        if (0.0 <= this->m_t[3]) {
          bVar2 = this->m_t[3] <= 0.5;
        }
        if (bVar2) {
          ON_SubDComponentId::ON_SubDComponentId
                    (&stack0xffffffffffffff78,Face,(this->m_t_ci).m_index);
          ON_SubDFaceCornerDex::ON_SubDFaceCornerDex
                    ((ON_SubDFaceCornerDex *)((long)&fp.m_t + 4),(uint)(long)this->m_t[0],
                     (uint)(long)this->m_t[1]);
          local_ac = fp.m_t._4_4_;
          ON_SubDFaceParameter::ON_SubDFaceParameter
                    ((ON_SubDFaceParameter *)local_a8,fp.m_t._4_4_,this->m_t[2],this->m_t[3]);
          fp_00.m_s = (double)fp._0_8_;
          fp_00._0_8_ = local_a8;
          fp_00.m_t = fp.m_s;
          ON_SubDComponentParameter::ON_SubDComponentParameter(&local_c8,OStack_88,fp_00);
          *(ON_SubDComponentId *)vertex_id = local_c8.m_cid;
          *(anon_union_8_3_6bf0bb0e_for_m_p0 *)((long)vertex_id + 8) = local_c8.m_p0;
          *(anon_union_8_3_7b68a318_for_m_p1 *)((long)vertex_id + 0x10) = local_c8.m_p1;
        }
      }
    }
  }
  bVar2 = ON_SubDComponentParameter::IsSet((ON_SubDComponentParameter *)vertex_id);
  return bVar2;
}

Assistant:

bool ON_ObjRefEvaluationParameter::GetSubDComponentParameter(
  ON_SubDComponentParameter& cp
) const
{
  cp = ON_SubDComponentParameter::Unset;
  if (9 == this->m_t_type)
  {
    switch (this->m_t_ci.m_type)
    {
    case ON_COMPONENT_INDEX::TYPE::subd_vertex:
      if (false == Internal_IsValidUnsigned(this->m_t[0]))
        break;
      if (false == Internal_IsValidUnsigned(this->m_t[1]))
        break;
      if (false == (0.0 == this->m_t[2]))
        break;
      if (false == (0.0 == this->m_t[3]))
        break;
      {
        const ON_SubDComponentId vertex_id(ON_SubDComponentPtr::Type::Vertex, this->m_t_ci.m_index);
        cp = ON_SubDComponentParameter(
          vertex_id, 
          Internal_ComponentIdFromDouble(ON_SubDComponentPtr::Type::Edge, this->m_t[0]),
          Internal_ComponentIdFromDouble(ON_SubDComponentPtr::Type::Face, this->m_t[1]));
      }
      break;
    case ON_COMPONENT_INDEX::TYPE::subd_edge:
      if (false == Internal_IsValidUnsigned(this->m_t[0]))
        break;
      if (false == (0.0 <= this->m_t[1] && this->m_t[1] <= 1.0))
        break;
      if (false == (0.0 == this->m_t[2]))
        break;
      if (false == (0.0 == this->m_t[3]))
        break;
      {
        const ON_SubDComponentId edge_id(ON_SubDComponentPtr::Type::Edge, this->m_t_ci.m_index);
        cp = ON_SubDComponentParameter(
          edge_id,
          this->m_t[1],
          Internal_ComponentIdFromDouble(ON_SubDComponentPtr::Type::Face, this->m_t[0]));
      }
      break;
    case ON_COMPONENT_INDEX::TYPE::subd_face:
      if (false == Internal_IsValidUnsigned(this->m_t[0]))
        break;
      if (false == Internal_IsValidUnsigned(this->m_t[1]))
        break;
      if (false == (this->m_t[0] < this->m_t[1]))
        break;
      if (false == (0.0 <= this->m_t[2] && this->m_t[2] <= 0.5))
        break;
      if (false == (0.0 <= this->m_t[3] && this->m_t[3] <= 0.5))
        break;
      {
        const ON_SubDComponentId face_id(ON_SubDComponentPtr::Type::Face, this->m_t_ci.m_index);
        const ON_SubDFaceCornerDex cdex((unsigned)this->m_t[0], (unsigned)this->m_t[1]);
        ON_SubDFaceParameter fp(cdex, this->m_t[2], this->m_t[3]);
        cp = ON_SubDComponentParameter(face_id, fp);
      }
      break;
    default:
      break;
    }
  }
  return cp.IsSet();
}